

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_validate_archive(mz_zip_archive *pZip,mz_uint flags)

{
  mz_bool mVar1;
  int iVar2;
  undefined1 local_4e0 [8];
  mz_zip_archive_file_stat stat;
  mz_uint32 found_index;
  uint32_t i;
  mz_zip_internal_state *pState;
  mz_uint flags_local;
  mz_zip_archive *pZip_local;
  
  if ((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_pAlloc == (mz_alloc_func)0x0)) ||
     ((pZip->m_pFree == (mz_free_func)0x0 || (pZip->m_pRead == (mz_file_read_func)0x0)))) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    return 0;
  }
  if (pZip->m_pState->m_zip64 == 0) {
    if (0xffff < pZip->m_total_files) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      }
      return 0;
    }
    if (0xffffffff < pZip->m_archive_size) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      }
      return 0;
    }
  }
  else {
    if (pZip->m_total_files == 0xffffffff) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      }
      return 0;
    }
    if (0xfffffffe < (pZip->m_pState->m_central_dir).m_size) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      }
      return 0;
    }
  }
  stat.m_comment[0x1fc] = '\0';
  stat.m_comment[0x1fd] = '\0';
  stat.m_comment[0x1fe] = '\0';
  stat.m_comment[0x1ff] = '\0';
  do {
    if (pZip->m_total_files <= (uint)stat.m_comment._508_4_) {
      return 1;
    }
    if ((flags & 0x1000) != 0) {
      mVar1 = mz_zip_reader_file_stat
                        (pZip,stat.m_comment._508_4_,(mz_zip_archive_file_stat *)local_4e0);
      if (mVar1 == 0) {
        return 0;
      }
      iVar2 = mz_zip_reader_locate_file_v2
                        (pZip,(char *)&stat.m_is_encrypted,(char *)0x0,0,
                         (mz_uint32 *)(stat.m_comment + 0x1f8));
      if (iVar2 == 0) {
        return 0;
      }
      if (stat.m_comment._504_4_ != stat.m_comment._508_4_) {
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
        }
        return 0;
      }
    }
    mVar1 = mz_zip_validate_file(pZip,stat.m_comment._508_4_,flags);
    if (mVar1 == 0) {
      return 0;
    }
    stat.m_comment._508_4_ = stat.m_comment._508_4_ + 1;
  } while( true );
}

Assistant:

mz_bool mz_zip_validate_archive(mz_zip_archive *pZip, mz_uint flags)
{
    mz_zip_internal_state *pState;
    uint32_t i;

    if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Basic sanity checks */
    if (!pState->m_zip64)
    {
        if (pZip->m_total_files > MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (pZip->m_archive_size > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }
    else
    {
        if (pZip->m_total_files >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    for (i = 0; i < pZip->m_total_files; i++)
    {
        if (MZ_ZIP_FLAG_VALIDATE_LOCATE_FILE_FLAG & flags)
        {
            mz_uint32 found_index;
            mz_zip_archive_file_stat stat;

            if (!mz_zip_reader_file_stat(pZip, i, &stat))
                return MZ_FALSE;

            if (!mz_zip_reader_locate_file_v2(pZip, stat.m_filename, NULL, 0, &found_index))
                return MZ_FALSE;

            /* This check can fail if there are duplicate filenames in the archive (which we don't check for when writing - that's up to the user) */
            if (found_index != i)
                return mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
        }

        if (!mz_zip_validate_file(pZip, i, flags))
            return MZ_FALSE;
    }

    return MZ_TRUE;
}